

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_asformat.cpp
# Opt level: O2

int __thiscall
icu_63::number::impl::LocalizedNumberFormatterAsFormat::clone
          (LocalizedNumberFormatterAsFormat *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  LocalizedNumberFormatterAsFormat *this_00;
  
  this_00 = (LocalizedNumberFormatterAsFormat *)UMemory::operator_new((UMemory *)0x3f8,(size_t)__fn)
  ;
  if (this_00 != (LocalizedNumberFormatterAsFormat *)0x0) {
    LocalizedNumberFormatterAsFormat(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Format* LocalizedNumberFormatterAsFormat::clone() const {
    return new LocalizedNumberFormatterAsFormat(*this);
}